

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

void __thiscall
helics::CoreFactory::addAssociatedCoreType(CoreFactory *this,string_view name,CoreType type)

{
  allocator<char> local_39;
  string local_38;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = (char *)name._M_len;
  local_18._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_38,&local_18,&local_39);
  gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::addType
            ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)searchableCores,&local_38,
             (CoreType)name._M_str);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_38,&local_18,&local_39);
  addExtraTypes(&local_38,(CoreType)name._M_str);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void addAssociatedCoreType(std::string_view name, CoreType type)
{
    searchableCores.addType(std::string{name}, type);
    addExtraTypes(std::string{name}, type);
}